

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

bool __thiscall clipp::parser::check_conflicts(parser *this,dfs_traverser *match)

{
  pointer pcVar1;
  pointer paVar2;
  pointer paVar3;
  group *pgVar4;
  pointer pcVar5;
  pointer paVar6;
  bool bVar7;
  context *m;
  pointer pcVar8;
  pointer paVar9;
  context *c;
  pointer pcVar10;
  
  if ((this->pos_).repeatGroupStarted_ == false) {
    pcVar1 = (match->stack_).
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    paVar2 = (this->args_).
             super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar3 = (this->args_).
             super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar7 = false;
    for (pcVar8 = (match->stack_).
                  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                  ._M_impl.super__Vector_impl_data._M_start; pcVar8 != pcVar1; pcVar8 = pcVar8 + 1)
    {
      pgVar4 = pcVar8->parent;
      paVar9 = paVar3;
      if (pgVar4->exclusive_ == true) {
        do {
          if (paVar9 == paVar2) break;
          if (paVar9[-1].blocked_ == false) {
            pcVar5 = paVar9[-1].match_.stack_.
                     super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pcVar10 = paVar9[-1].match_.stack_.
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           ._M_impl.super__Vector_impl_data._M_start; pcVar10 != pcVar5;
                pcVar10 = pcVar10 + 1) {
              if ((pcVar10->parent == pgVar4) &&
                 ((pcVar10->cur)._M_current != (pcVar8->cur)._M_current)) {
                paVar9[-1].conflict_ = true;
                bVar7 = true;
              }
            }
          }
          paVar6 = paVar9 + -1;
          paVar9 = paVar9 + -1;
        } while (paVar6->startsRepeatGroup_ != true);
      }
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool check_conflicts(const dfs_traverser& match)
    {
        if(pos_.start_of_repeat_group()) return false;
        bool conflict = false;
        for(const auto& m : match.stack()) {
            if(m.parent->exclusive()) {
                for(auto i = args_.rbegin(); i != args_.rend(); ++i) {
                    if(!i->blocked()) {
                        for(const auto& c : i->match_.stack()) {
                            //sibling within same exclusive group => conflict
                            if(c.parent == m.parent && c.cur != m.cur) {
                                conflict = true;
                                i->conflict_ = true;
                            }
                        }
                    }
                    //check for conflicts only within current repeat cycle
                    if(i->startsRepeatGroup_) break;
                }
            }
        }
        return conflict;
    }